

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

uint8_t absl::strings_internal::CordTestAccess::LengthToTag(size_t s)

{
  uint8_t uVar1;
  AlphaNum *in_RCX;
  string_view local_b8 [3];
  string local_88;
  string death_message;
  AlphaNum local_48;
  
  if (s < 0xff4) {
    uVar1 = cord_internal::AllocatedSizeToTag(s + 0xd);
    return uVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&death_message,"Check s <= kMaxFlatLength failed: ",
             (allocator<char> *)local_b8);
  local_b8[0] = NullSafeStringView("Invalid length ");
  AlphaNum::AlphaNum(&local_48,s);
  StrCat_abi_cxx11_(&local_88,(absl *)local_b8,&local_48,in_RCX);
  std::__cxx11::string::operator+=((string *)&death_message,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
            (3,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/cord.cc"
             ,0x622,&death_message);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/cord.cc"
                ,0x622,"static uint8_t absl::strings_internal::CordTestAccess::LengthToTag(size_t)")
  ;
}

Assistant:

uint8_t CordTestAccess::LengthToTag(size_t s) {
  ABSL_INTERNAL_CHECK(s <= kMaxFlatLength, absl::StrCat("Invalid length ", s));
  return cord_internal::AllocatedSizeToTag(s + cord_internal::kFlatOverhead);
}